

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::MultiPartInputFile::~MultiPartInputFile(MultiPartInputFile *this)

{
  _Base_ptr p_Var1;
  Data *this_00;
  _Self __tmp;
  
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__MultiPartInputFile_02f9cf98;
  this_00 = this->_data;
  for (p_Var1 = (this_00->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this_00->_inputFiles)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
      this_00 = this->_data;
    }
  }
  if (this_00 != (Data *)0x0) {
    Data::~Data(this_00);
  }
  operator_delete(this_00,0xa8);
  GenericInputFile::~GenericInputFile(&this->super_GenericInputFile);
  return;
}

Assistant:

MultiPartInputFile::~MultiPartInputFile()
{
    for (map<int, GenericInputFile*>::iterator it = _data->_inputFiles.begin();
         it != _data->_inputFiles.end(); it++)
    {
        delete it->second;
    }

    delete _data;
}